

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void hessenberg(double *A,int N)

{
  ulong uVar1;
  size_t __size;
  ulong uVar2;
  int m;
  int i;
  double *x;
  double *v;
  double *A_00;
  double *C;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int N_00;
  ulong uVar8;
  int n;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  int N_1;
  int N_2;
  double *local_48;
  
  __size = (long)N * 8;
  x = (double *)malloc(__size);
  v = (double *)malloc(__size);
  A_00 = (double *)malloc(__size * (long)N);
  C = (double *)malloc(__size);
  if (2 < N) {
    uVar2 = (ulong)(uint)N;
    local_48 = A + uVar2;
    lVar10 = uVar2 << 0x20;
    _N_1 = 1;
    uVar4 = 0;
    uVar12 = uVar2;
    uVar6 = uVar2;
    lVar11 = lVar10;
    _N_2 = A;
    do {
      lVar11 = lVar11 + -0x100000000;
      uVar6 = uVar6 - 1;
      uVar1 = uVar4 + 1;
      if (uVar1 < uVar2) {
        uVar5 = 0;
        pdVar3 = local_48;
        do {
          x[uVar5] = *pdVar3;
          uVar5 = uVar5 + 1;
          pdVar3 = pdVar3 + uVar2;
        } while (uVar6 != uVar5);
      }
      m = (int)(uVar2 - uVar4);
      N_00 = m + -1;
      dVar13 = house(x,N_00,v);
      if (uVar1 < uVar2) {
        lVar7 = 0;
        pdVar3 = local_48;
        uVar5 = _N_1;
        do {
          uVar8 = 0;
          lVar9 = lVar7;
          do {
            *(double *)((long)A_00 + (lVar9 >> 0x1d)) = pdVar3[uVar8];
            lVar9 = lVar9 + (uVar6 << 0x20);
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + 0x100000000;
          pdVar3 = pdVar3 + uVar2;
        } while (uVar5 != uVar2);
      }
      n = ~(uint)uVar4 + N;
      mmult(A_00,v,C,m,n,1);
      if (0 < (long)(uVar2 - uVar4)) {
        uVar4 = 0;
        do {
          C[uVar4] = C[uVar4] * dVar13;
          uVar4 = uVar4 + 1;
        } while (uVar12 != uVar4);
      }
      mmult(v,C,A_00,n,1,m);
      if (uVar1 < uVar2) {
        lVar7 = 0;
        pdVar3 = local_48;
        uVar4 = _N_1;
        do {
          uVar5 = 0;
          lVar9 = lVar7;
          do {
            pdVar3[uVar5] = pdVar3[uVar5] - *(double *)((long)A_00 + (lVar9 >> 0x1d));
            uVar5 = uVar5 + 1;
            lVar9 = lVar9 + 0x100000000;
          } while (uVar12 != uVar5);
          uVar4 = uVar4 + 1;
          pdVar3 = pdVar3 + uVar2;
          lVar7 = lVar7 + lVar10;
        } while (uVar4 != uVar2);
      }
      lVar7 = 0;
      uVar4 = 0;
      pdVar3 = _N_2;
      do {
        if (uVar1 < uVar2) {
          uVar5 = 1;
          lVar9 = lVar7;
          do {
            *(double *)((long)A_00 + (lVar9 >> 0x1d)) = pdVar3[uVar5];
            uVar5 = uVar5 + 1;
            lVar9 = lVar9 + 0x100000000;
          } while (uVar12 != uVar5);
        }
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + uVar2;
        lVar7 = lVar7 + lVar11;
      } while (uVar4 != uVar2);
      mmult(A_00,v,C,N,N_00,1);
      uVar4 = 0;
      do {
        C[uVar4] = C[uVar4] * dVar13;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      mmult(C,v,A_00,N,1,N_00);
      lVar7 = 0;
      uVar4 = 0;
      pdVar3 = _N_2;
      do {
        if (uVar1 < uVar2) {
          uVar5 = 1;
          lVar9 = lVar7;
          do {
            pdVar3[uVar5] = pdVar3[uVar5] - *(double *)((long)A_00 + (lVar9 >> 0x1d));
            uVar5 = uVar5 + 1;
            lVar9 = lVar9 + 0x100000000;
          } while (uVar12 != uVar5);
        }
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + uVar2;
        lVar7 = lVar7 + lVar11;
      } while (uVar4 != uVar2);
      _N_1 = _N_1 + 1;
      local_48 = local_48 + uVar2 + 1;
      uVar12 = uVar12 - 1;
      lVar10 = lVar10 + -0x100000000;
      _N_2 = _N_2 + 1;
      uVar4 = uVar1;
    } while (uVar1 != N - 2);
  }
  free(x);
  free(v);
  free(A_00);
  free(C);
  return;
}

Assistant:

void hessenberg(double *A,int N) {
	int k,i,j,t,u;
	double *x,*v,*AT,*w;
	double beta;
	x = (double*) malloc(sizeof(double) * N);
	v = (double*) malloc(sizeof(double) * N);
	AT = (double*) malloc(sizeof(double) * N * N);
	w = (double*) malloc(sizeof(double) * N);
	
	for (k = 0; k < N-2;++k) {
		for(i=k + 1;i < N;++i) {
			x[i-k-1] = A[i*N+k];
			//printf("x %lf \n",x[i-k-1]);
			
		}
		
		beta = house(x,N-k-1,v);
		
		
		for (i=k+1; i < N; i++) {
			t = i * N;
			u = 0;
			for (j=k; j < N; j++) {
				AT[u+i-k-1] = A[j+t];
				u+=(N-k-1);				
			}
		}
		//mdisplay(AT,N-k,N-k-1);
		
		
		mmult(AT,v,w,N-k,N-k-1,1);
		scale(w,N-k,1,beta);
		mmult(v,w,AT,N-k-1,1,N-k);
		//mdisplay(AT,N-k-1,N-k);
		
		for (i=k+1; i < N; i++) {
			t = i * N;
			for (j=k; j < N; j++) {
				A[t+j] -= AT[(i-k-1)*(N-k) + j - k];
			}
		}
		//mdisplay(A,N,N);
		
		for (i=0; i < N; i++) {
			t = i * N;
			u = i * (N-k-1);
			for (j=k+1; j < N; j++) {
				AT[u+j-k-1] = A[t+j];
			}
		}
		//mdisplay(AT,N,N-k-1);
		
		mmult(AT,v,w,N,N-k-1,1);
		scale(w,N,1,beta);
		mmult(w,v,AT,N,1,N-k-1);
		//mdisplay(AT,N,N-k-1);
		
		for (i=0; i < N; i++) {
			t = i * N;
			u = i * (N-k-1);
			for (j=k+1; j < N; j++) {
				A[t+j] -= AT[u+j-k-1];
			}
		}
		
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
}